

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

uint32_t __thiscall hrgls::datablob::DataBlob::Size(DataBlob *this)

{
  hrgls_Status hVar1;
  uint8_t *local_28;
  uint8_t *data;
  DataBlob *pDStack_18;
  uint32_t ret;
  DataBlob *this_local;
  
  data._4_4_ = 0;
  if (this->m_private->blob == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
    this_local._4_4_ = 0;
  }
  else {
    pDStack_18 = this;
    hVar1 = hrgls_DataBlobGetData(this->m_private->blob,&local_28,(uint32_t *)((long)&data + 4));
    this->m_private->status = hVar1;
    this_local._4_4_ = data._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t DataBlob::Size() const
    {
      uint32_t ret = 0;
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      const uint8_t *data;
      m_private->status = hrgls_DataBlobGetData(m_private->blob, &data, &ret);
      return ret;
    }